

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O2

bool __thiscall chatra::Thread::restoreTemporaryLock(Thread *this)

{
  pointer *pppVar1;
  pointer pFVar2;
  bool bVar3;
  pointer pRVar4;
  undefined1 local_48 [8];
  vector<chatra::Reference,_std::allocator<chatra::Reference>_> temp;
  
  pFVar2 = (this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
           super__Vector_impl_data._M_finish;
  Lock::getTemporary((vector<chatra::Reference,_std::allocator<chatra::Reference>_> *)local_48,
                     pFVar2[-1].lock);
  do {
    pRVar4 = (pointer)local_48;
    if (pRVar4 == temp.super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
      Lock::temporaryLockRestored(pFVar2[-1].lock);
      pppVar1 = &pFVar2[-1].stack.
                 super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pppVar1 = *pppVar1 + -1;
      break;
    }
    bVar3 = lockReference(this,pRVar4->node,Temporary);
    local_48 = (undefined1  [8])(pRVar4 + 1);
  } while (bVar3);
  std::_Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>::~_Vector_base
            ((_Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_> *)local_48);
  return pRVar4 == temp.super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                   _M_impl.super__Vector_impl_data._M_start;
}

Assistant:

bool Thread::restoreTemporaryLock() {
	auto& f = frames.back();
	auto temp = f.lock->getTemporary();
	for (auto ref : temp) {
		if (!lockReference(ref, LockType::Temporary))
			return false;
	}
	f.lock->temporaryLockRestored();
	f.stack.pop_back();
	return true;
}